

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

int CVmRun::set_index(vm_val_t *container_val,vm_val_t *index_val,vm_val_t *new_val)

{
  CVmObject *pCVar1;
  undefined8 in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  vm_val_t *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (in_RDI->typ == VM_OBJ) {
    pCVar1 = vm_objp(0);
    iVar2 = (*pCVar1->_vptr_CVmObject[0x28])(pCVar1,in_RDI,(ulong)(in_RDI->val).obj,in_RSI,in_RDX);
  }
  else if (in_RDI->typ == VM_LIST) {
    get_const_ptr(0);
    CVmObjList::set_index_list
              (unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               in_RDI,in_RSI);
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int CVmRun::set_index(VMG_ vm_val_t *container_val,
                      const vm_val_t *index_val,
                      const vm_val_t *new_val)
{
    switch(container_val->typ)
    {
    case VM_LIST:
        /* list constant - use the static list set-index method */
        CVmObjList::set_index_list(vmg_ container_val,
                                   get_const_ptr(vmg_ container_val->val.ofs),
                                   index_val, new_val);
        return TRUE;

    case VM_OBJ:
        /* object - use the object's virtual set-index method */
        return vm_objp(vmg_ container_val->val.obj)
            ->set_index_val_q(vmg_ container_val,
                              container_val->val.obj, index_val, new_val);
        
    default:
        /* other values cannot be indexed */
        return FALSE;
    }
}